

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

void __thiscall
loader::Logger::Logger
          (Logger *this,string *logger_name,string *filename,string *log_level,
          bool logging_enabled_env,string *format)

{
  logger *this_00;
  undefined7 in_register_00000081;
  undefined1 auStack_f8 [16];
  string local_e8;
  string local_c8;
  _Any_data local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this->log_to_console = true;
  this->logging_enabled = false;
  (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((int)CONCAT71(in_register_00000081,logging_enabled_env) != 0) {
    this->logging_enabled = true;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    spdlog::basic_logger_st<spdlog::synchronous_factory>
              ((string *)auStack_f8,logger_name,SUB81(filename,0),(file_event_handlers *)0x0);
    std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)auStack_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_f8 + 8));
    spdlog::file_event_handlers::~file_event_handlers((file_event_handlers *)&local_a8);
    if (format->_M_string_length != 0) {
      this_00 = (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      std::__cxx11::string::string((string *)&local_c8,(string *)format);
      spdlog::logger::set_pattern(this_00,&local_c8,local);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::__cxx11::string::string((string *)(auStack_f8 + 0x10),(string *)log_level);
    setLogLevel(this,(string *)(auStack_f8 + 0x10));
    std::__cxx11::string::~string((string *)(auStack_f8 + 0x10));
  }
  return;
}

Assistant:

Logger(std::string logger_name, std::string filename, std::string log_level, bool logging_enabled_env, std::string format = "") {
    if (logging_enabled_env) {
      logging_enabled = logging_enabled_env;
      try {
        _logger = spdlog::basic_logger_st(logger_name, filename);
      } catch (spdlog::spdlog_ex &exception) {
        std::cerr << "Unable to create log file: " << exception.what() << "\n";
        logging_enabled = false;
        return;
      }

      if (!format.empty()) {
        _logger->set_pattern(format);
      }

      setLogLevel(log_level);
    }
  }